

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_remove(REF_INTERP ref_interp,REF_INT node)

{
  REF_STATUS RVar1;
  undefined8 in_R9;
  
  RVar1 = 0;
  if ((ref_interp != (REF_INTERP)0x0) && (ref_interp->continuously != 0)) {
    if ((long)ref_interp->agent_hired[node] == 0) {
      if (ref_interp->cell[node] != -1) {
        ref_interp->cell[node] = -1;
        return 0;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x16b,"ref_interp_remove","remove node no located",in_R9,0);
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x16a,"ref_interp_remove","remove node agent hired",0,
             (long)ref_interp->agent_hired[node]);
    }
    RVar1 = 1;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_interp_remove(REF_INTERP ref_interp, REF_INT node) {
  if (NULL == ref_interp) return REF_SUCCESS;
  if (!ref_interp_continuously(ref_interp)) return REF_SUCCESS;
  REIS(REF_FALSE, ref_interp->agent_hired[node], "remove node agent hired");
  RUS(REF_EMPTY, ref_interp_cell(ref_interp, node), "remove node no located");
  ref_interp->cell[node] = REF_EMPTY;
  return REF_SUCCESS;
}